

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell::
~TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell
          (TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell *this)

{
  TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell *mem;
  TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell *this_local;
  
  mem = this;
  ~TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(MinipointCounterTest, OwnAndRoundWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::EastWind);

	addPair(Tile::EastWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(24, m.total(false));
}